

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PropertiesIterator.h
# Opt level: O1

PropertiesIterator * __thiscall Rml::PropertiesIterator::operator++(PropertiesIterator *this)

{
  NodePtr pDVar1;
  bool bVar2;
  PropertyId id;
  Iter<true> *this_00;
  
  this_00 = &this->it_style;
  if ((this->it_style).mKeyVals == (this->it_style_end).mKeyVals) {
    this_00 = &this->it_definition;
  }
  do {
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(this_00);
    pDVar1 = (this->it_style).mKeyVals;
    if (pDVar1 == (this->it_style_end).mKeyVals) goto LAB_002316b6;
    id = (pDVar1->mData).first;
    bVar2 = ::std::bitset<128UL>::test((bitset<128UL> *)this,(ulong)id);
    this_00 = &this->it_style;
  } while (bVar2);
LAB_002316d4:
  PropertyIdSet::Insert(&this->iterated_properties,id);
  return this;
LAB_002316b6:
  while( true ) {
    pDVar1 = (this->it_definition).mKeyVals;
    if (pDVar1 == (this->it_definition_end).mKeyVals) {
      this->at_end = true;
      return this;
    }
    id = (pDVar1->mData).first;
    bVar2 = ::std::bitset<128UL>::test((bitset<128UL> *)this,(ulong)id);
    if (!bVar2) break;
    robin_hood::detail::
    Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
    ::Iter<true>::operator++(&this->it_definition);
  }
  goto LAB_002316d4;
}

Assistant:

PropertiesIterator& operator++()
	{
		if (it_style != it_style_end)
			// We iterate over the local style properties first
			++it_style;
		else
			// .. and then over the properties given by the element's definition
			++it_definition;
		// If we reached the end of one of the iterator pairs, we need to continue iteration on the next pair.
		ProceedToNextValid();
		return *this;
	}